

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O3

int Assimp_Dump(char **params,uint num)

{
  bool bVar1;
  bool compressed;
  bool shortened;
  int iVar2;
  uint uVar3;
  aiScene *scene;
  FILE *__stream;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  string out;
  string in;
  string cmd;
  ImportData import;
  ImportData *in_stack_ffffffffffffff08;
  long *local_e0 [2];
  long local_d0 [2];
  string local_c0;
  char *local_a0;
  undefined8 local_98;
  char local_90;
  undefined7 uStack_8f;
  ImportData local_80;
  long *local_50 [2];
  long local_40 [2];
  
  pcVar4 = *params;
  if (*pcVar4 == '-') {
    if ((((pcVar4[1] != 'h') || (pcVar4[2] != '\0')) &&
        (iVar2 = strcmp(pcVar4,"--help"), iVar2 != 0)) &&
       ((pcVar4[1] != '?' || (pcVar4[2] != '\0')))) {
LAB_002e74e8:
      if (num == 0) {
        puts("assimp dump: Invalid number of arguments. See \'assimp dump --help\'\r");
        return 1;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,pcVar4,(allocator<char> *)&local_80);
      if (num == 1) {
        local_e0[0] = local_d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"-","");
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_e0,params[1],(allocator<char> *)&local_80);
      }
      local_a0 = &local_90;
      local_98 = 0;
      local_90 = '\0';
      uVar3 = ((char)*local_e0[0] != '-') + 1;
      if (uVar3 < num) {
        uVar5 = (ulong)uVar3;
        do {
          if (params[uVar5] != (char *)0x0) {
            std::__cxx11::string::append((char *)&local_a0);
            std::__cxx11::string::append((char *)&local_a0);
          }
          uVar5 = uVar5 + 1;
        } while (num != (uint)uVar5);
      }
      local_80.logFile._M_dataplus._M_p = (pointer)&local_80.logFile.field_2;
      local_80.ppFlags = 0;
      local_80.showLog = false;
      local_80.logFile._M_string_length = 0;
      local_80.logFile.field_2._M_local_buf[0] = '\0';
      local_80.verbose = false;
      local_80.log = false;
      ProcessStandardArguments(&local_80,params + 1,num - 1);
      if (num == 1) {
        bVar1 = false;
        shortened = false;
        compressed = false;
      }
      else {
        uVar5 = 2;
        if (2 < num) {
          uVar5 = (ulong)num;
        }
        uVar6 = 1;
        compressed = false;
        shortened = false;
        bVar1 = false;
        do {
          pcVar4 = params[uVar6];
          if (pcVar4 != (char *)0x0) {
            if (*pcVar4 == '-') {
              if (((pcVar4[1] == 'b') && (pcVar4[2] == '\0')) ||
                 (iVar2 = strcmp(pcVar4,"--binary"), iVar2 == 0)) {
LAB_002e76cd:
                bVar1 = true;
              }
              else {
                if (pcVar4[1] == 's') {
                  if (pcVar4[2] == '\0') goto LAB_002e76fb;
                  iVar2 = strcmp(pcVar4,"--short");
                }
                else {
                  iVar2 = strcmp(pcVar4,"--short");
                }
                if (iVar2 == 0) {
LAB_002e76fb:
                  shortened = true;
                }
                else {
                  if ((pcVar4[1] != 'z') || (pcVar4[2] != '\0')) goto LAB_002e76b2;
LAB_002e76c5:
                  compressed = true;
                }
              }
            }
            else {
              iVar2 = strcmp(pcVar4,"--binary");
              if (iVar2 == 0) goto LAB_002e76cd;
              iVar2 = strcmp(pcVar4,"--short");
              if (iVar2 == 0) goto LAB_002e76fb;
LAB_002e76b2:
              iVar2 = strcmp(pcVar4,"--compressed");
              if (iVar2 == 0) goto LAB_002e76c5;
            }
          }
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      if ((char)*local_e0[0] == '-') {
        std::__cxx11::string::rfind((char)&local_c0,0x2e);
        std::__cxx11::string::substr((ulong)local_50,(ulong)&local_c0);
        std::__cxx11::string::operator=((string *)local_e0,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        std::__cxx11::string::append((char *)local_e0);
        if ((bool)(shortened & bVar1)) {
          std::__cxx11::string::append((char *)local_e0);
        }
      }
      scene = ImportModel(&local_80,&local_c0);
      if (scene == (aiScene *)0x0) {
        printf("assimp dump: Unable to load input file %s\n",local_c0._M_dataplus._M_p);
        iVar2 = 5;
      }
      else {
        pcVar4 = "wt";
        if (bVar1) {
          pcVar4 = "wb";
        }
        __stream = fopen((char *)local_e0[0],pcVar4);
        if (__stream == (FILE *)0x0) {
          printf("assimp dump: Unable to open output file %s\n",local_e0[0]);
          iVar2 = 0xc;
        }
        else {
          if (bVar1) {
            WriteBinaryDump(scene,(FILE *)__stream,local_c0._M_dataplus._M_p,local_a0,shortened,
                            compressed,in_stack_ffffffffffffff08);
          }
          else {
            WriteDump(scene,(FILE *)__stream,local_c0._M_dataplus._M_p,local_a0,shortened);
          }
          fclose(__stream);
          if ((bool)(compressed & bVar1)) {
            CompressBinaryDump((char *)local_e0[0],0x200);
          }
          iVar2 = 0;
          printf("assimp dump: Wrote output dump %s\n",local_e0[0]);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.logFile._M_dataplus._M_p != &local_80.logFile.field_2) {
        operator_delete(local_80.logFile._M_dataplus._M_p,
                        CONCAT71(local_80.logFile.field_2._M_allocated_capacity._1_7_,
                                 local_80.logFile.field_2._M_local_buf[0]) + 1);
      }
      if (local_a0 != &local_90) {
        operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
      }
      if (local_e0[0] != local_d0) {
        operator_delete(local_e0[0],local_d0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p == &local_c0.field_2) {
        return iVar2;
      }
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      return iVar2;
    }
  }
  else {
    iVar2 = strcmp(pcVar4,"--help");
    if (iVar2 != 0) goto LAB_002e74e8;
  }
  printf("%s",AICMD_MSG_DUMP_HELP);
  return 0;
}

Assistant:

int Assimp_Dump (const char* const* params, unsigned int num)
{
	const char* fail = "assimp dump: Invalid number of arguments. "
			"See \'assimp dump --help\'\r\n";

	// --help
	if (!strcmp( params[0], "-h") || !strcmp( params[0], "--help") || !strcmp( params[0], "-?") ) {
		printf("%s",AICMD_MSG_DUMP_HELP);
		return 0;
	}

	// asssimp dump in out [options]
	if (num < 1) {
		printf("%s", fail);
		return 1;
	}

	std::string in  = std::string(params[0]);
	std::string out = (num > 1 ? std::string(params[1]) : std::string("-"));

	// store full command line
	std::string cmd;
	for (unsigned int i = (out[0] == '-' ? 1 : 2); i < num;++i)	{
		if (!params[i])continue;
		cmd.append(params[i]);
		cmd.append(" ");
	}

	// get import flags
	ImportData import;
	ProcessStandardArguments(import,params+1,num-1);

	bool binary = false, shortened = false,compressed=false;
	
	// process other flags
	for (unsigned int i = 1; i < num;++i)		{
		if (!params[i])continue;
		if (!strcmp( params[i], "-b") || !strcmp( params[i], "--binary")) {
			binary = true;
		}
		else if (!strcmp( params[i], "-s") || !strcmp( params[i], "--short")) {
			shortened = true;
		}
		else if (!strcmp( params[i], "-z") || !strcmp( params[i], "--compressed")) {
			compressed = true;
		}
#if 0
		else if (i > 2 || params[i][0] == '-') {
			::printf("Unknown parameter: %s\n",params[i]);
			return 10;
		}
#endif
	}

	if (out[0] == '-') {
		// take file name from input file
		std::string::size_type s = in.find_last_of('.');
		if (s == std::string::npos) {
			s = in.length();
		}

		out = in.substr(0,s);
		out.append((binary ? ".assbin" : ".assxml"));
		if (shortened && binary) {
			out.append(".regress");
		}
	}

	// import the main model
	const aiScene* scene = ImportModel(import,in);
	if (!scene) {
		printf("assimp dump: Unable to load input file %s\n",in.c_str());
		return 5;
	}

	// open the output file and build the dump
	FILE* o = ::fopen(out.c_str(),(binary ? "wb" : "wt"));
	if (!o) {
		printf("assimp dump: Unable to open output file %s\n",out.c_str());
		return 12;
	}

	if (binary) {
		WriteBinaryDump (scene,o,in.c_str(),cmd.c_str(),shortened,compressed,import);
	}
	else WriteDump (scene,o,in.c_str(),cmd.c_str(),shortened);
	fclose(o);

	if (compressed && binary) {
		CompressBinaryDump(out.c_str(),ASSBIN_HEADER_LENGTH);
	}

	printf("assimp dump: Wrote output dump %s\n",out.c_str());
	return 0;
}